

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

Token * __thiscall JSON::Parser::readStringToken(Token *__return_storage_ptr__,Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int current;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  string value;
  long *local_98 [2];
  long local_88 [2];
  string *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  pcVar4 = &local_40;
  local_50 = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
  __return_storage_ptr__->type = STRING;
  local_78 = (string *)&__return_storage_ptr__->value;
  paVar1 = &(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_50 == pcVar4) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)((long)&(__return_storage_ptr__->value).field_2 + 8) = uStack_38;
  }
  else {
    (((string *)local_78)->_M_dataplus)._M_p = local_50;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
  }
  (__return_storage_ptr__->value)._M_string_length = local_48;
  local_48 = 0;
  local_40 = '\0';
  iVar6 = this->pos;
  __return_storage_ptr__->start = iVar6;
  this->pos = iVar6 + 1;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  iVar6 = this->length;
  current = this->pos;
  local_50 = pcVar4;
  if (current < iVar6) {
    bVar5 = false;
    do {
      lVar3 = (long)current;
      while (bVar5) {
        current = current + 1;
        this->pos = current;
        lVar3 = lVar3 + 1;
        bVar5 = false;
        if (iVar6 <= current) goto LAB_0010683d;
      }
      bVar2 = (this->input)._M_dataplus._M_p[lVar3];
      pcVar4 = (char *)(ulong)bVar2;
      if (bVar2 == 0x5c) {
        std::__cxx11::string::substr((ulong)local_98,(ulong)&this->input);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98[0]);
        if (local_98[0] != local_88) {
          operator_delete(local_98[0],local_88[0] + 1);
        }
        current = this->pos;
        bVar5 = true;
      }
      else if (bVar2 == 0x22) {
        pcVar4 = (char *)0x22;
        break;
      }
      current = current + 1;
      this->pos = current;
      iVar6 = this->length;
    } while (current < iVar6);
  }
LAB_0010683d:
  if ((int)pcVar4 != 0x22) {
    unexpected(this,TYPE_STRING,current);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)local_78 != paVar1) {
      operator_delete(*(undefined1 **)local_78,paVar1->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::string::substr((ulong)local_98,(ulong)&this->input);
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98[0]);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  this->pos = this->pos + 1;
  std::__cxx11::string::_M_assign(local_78);
  __return_storage_ptr__->end = this->pos;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Parser::readStringToken() {
        Token token(STRING, "");
        token.start = pos;
        int chunkStart = ++pos;
        int code;
        string value;
        bool isEscapeChar = false;

        while (isValidPos()) {
            if (isEscapeChar) {
                isEscapeChar = false;
                pos++;
                continue;
            }

            code = getCodeAt(pos);
            if (code == 34) { // '"'
                break;
            }
            if (code == 92) { // '\': escape
                isEscapeChar = true;
                value += input.substr(chunkStart, pos - chunkStart);
                chunkStart = ++pos;
            } else {
                pos++;
            }
        }

        if (code != 34) { // '"'
            unexpected(TYPE_STRING, pos);
        }

        value += input.substr(chunkStart, pos - chunkStart);
        pos++;
        token.value = value;
        token.end = pos;
        return token;
    }